

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O1

bool __thiscall
HighsMipSolverData::solutionRowFeasible
          (HighsMipSolverData *this,vector<double,_std::allocator<double>_> *solution)

{
  int iVar1;
  int iVar2;
  HighsLp *pHVar3;
  pointer piVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  pHVar3 = this->mipsolver->model_;
  piVar4 = (this->ARstart_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0;
  while (uVar6 = uVar5, uVar6 != (uint)pHVar3->num_row_) {
    iVar1 = piVar4[uVar6];
    iVar2 = piVar4[uVar6 + 1];
    dVar8 = 0.0;
    if (iVar2 != iVar1) {
      dVar10 = 0.0;
      lVar7 = 0;
      do {
        dVar11 = (solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start
                 [(this->ARindex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar1 + lVar7]] *
                 (this->ARvalue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar1 + lVar7];
        dVar9 = dVar8 + dVar11;
        dVar10 = dVar10 + (dVar8 - (dVar9 - dVar11)) + (dVar11 - (dVar9 - (dVar9 - dVar11)));
        lVar7 = lVar7 + 1;
        dVar8 = dVar9;
      } while (iVar2 - iVar1 != (int)lVar7);
      dVar8 = dVar9 + dVar10;
    }
    if (((pHVar3->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar6] + this->feastol < dVar8) ||
       (uVar5 = uVar6 + 1,
       dVar8 < (pHVar3->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6] - this->feastol)) break;
  }
  return uVar6 == (uint)pHVar3->num_row_;
}

Assistant:

bool HighsMipSolverData::solutionRowFeasible(
    const std::vector<double>& solution) const {
  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    HighsCDouble c_double_rowactivity = HighsCDouble(0.0);

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];

    for (HighsInt j = start; j != end; ++j)
      c_double_rowactivity += HighsCDouble(solution[ARindex_[j]] * ARvalue_[j]);

    double rowactivity = double(c_double_rowactivity);
    if (rowactivity > mipsolver.rowUpper(i) + feastol) return false;
    if (rowactivity < mipsolver.rowLower(i) - feastol) return false;
  }
  return true;
}